

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_line_ended(Parser *this)

{
  State *pSVar1;
  code *pcVar2;
  size_t sVar3;
  Location LVar4;
  bool bVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char msg [74];
  char local_58 [72];
  undefined2 local_10;
  
  if ((this->m_state->pos).super_LineCol.col != (this->m_state->line_contents).stripped.len + 1) {
    pcVar7 = "check failed: (m_state->pos.col == m_state->line_contents.stripped.len+1)";
    pcVar8 = local_58;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
      pcVar7 = pcVar7 + 8;
      pcVar8 = pcVar8 + 8;
    }
    local_10 = 0x29;
    if ((s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x76a6) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x76a6) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_58,0x4a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  pSVar1 = this->m_state;
  sVar3 = (pSVar1->pos).super_LineCol.line;
  (pSVar1->pos).super_LineCol.offset =
       ((pSVar1->line_contents).full.len - (pSVar1->line_contents).stripped.len) +
       (pSVar1->pos).super_LineCol.offset;
  (pSVar1->pos).super_LineCol.line = sVar3 + 1;
  (pSVar1->pos).super_LineCol.col = 1;
  return;
}

Assistant:

void Parser::_line_ended()
{
    _c4dbgpf("line[{}] ({} cols) ended! offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, m_state->pos.offset, m_state->pos.offset+m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == m_state->line_contents.stripped.len+1);
    m_state->pos.offset += m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    ++m_state->pos.line;
    m_state->pos.col = 1;
}